

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

void __thiscall mkvparser::Tags::Tag::Clear(Tag *this)

{
  SimpleTag *pSVar1;
  uint uVar2;
  
  while( true ) {
    pSVar1 = this->m_simple_tags;
    if (this->m_simple_tags_count < 1) break;
    uVar2 = this->m_simple_tags_count - 1;
    this->m_simple_tags_count = uVar2;
    SimpleTag::Clear(pSVar1 + uVar2);
  }
  if (pSVar1 != (SimpleTag *)0x0) {
    operator_delete__(&pSVar1[-1].m_tag_string);
  }
  this->m_simple_tags = (SimpleTag *)0x0;
  this->m_simple_tags_size = 0;
  return;
}

Assistant:

void Tags::Tag::Clear() {
  while (m_simple_tags_count > 0) {
    SimpleTag& d = m_simple_tags[--m_simple_tags_count];
    d.Clear();
  }

  delete[] m_simple_tags;
  m_simple_tags = NULL;

  m_simple_tags_size = 0;
}